

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_get_string(exr_const_context_t ctxt,int part_index,char *name,int32_t *length,char **out)

{
  char *in_RCX;
  exr_attribute_list_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_t **in_R8;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  long local_38;
  undefined4 in_stack_ffffffffffffffe8;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if ((in_RDX == (exr_attribute_list_t *)0x0) || ((char)in_RDX->num_attributes == '\0')) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->report_error)(in_RDI,3,"Invalid name for string attribute query");
    }
    else {
      local_4 = exr_attr_list_find_by_name
                          ((exr_const_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                           in_RCX,in_R8);
      if (local_4 == 0) {
        if (*(int *)(local_38 + 0x14) == 0x13) {
          if (in_RCX != (char *)0x0) {
            *(undefined4 *)in_RCX = **(undefined4 **)(local_38 + 0x18);
          }
          if (in_R8 != (exr_attribute_t **)0x0) {
            *in_R8 = *(exr_attribute_t **)(*(long *)(local_38 + 0x18) + 8);
          }
          if (in_RDI->mode == '\x01') {
            internal_exr_unlock(in_RDI);
          }
        }
        else {
          if (in_RDI->mode == '\x01') {
            internal_exr_unlock(in_RDI);
          }
          local_4 = (*in_RDI->print_error)
                              (in_RDI,0x10,
                               "\'%s\' requested type \'string\', but stored attributes is type \'%s\'"
                               ,in_RDX,*(undefined8 *)(local_38 + 8));
        }
      }
      else if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_get_string (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    int32_t*            length,
    const char**        out)
{
    ATTR_FIND_ATTR (EXR_ATTR_STRING, string);
    if (length) *length = attr->string->length;
    if (out) *out = attr->string->str;
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (rv);
}